

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# loader.cpp
# Opt level: O0

bool __thiscall Loader::writeBin(Loader *this,string *binFile,bool flash,string *loaderFile)

{
  bool bVar1;
  int iVar2;
  ostream *poVar3;
  string local_1d0 [36];
  int local_1ac;
  duration<long,_std::ratio<1L,_1000L>_> local_1a8;
  allocator local_199;
  string local_198 [39];
  allocator local_171;
  string local_170 [32];
  string local_150 [36];
  int local_12c;
  duration<long,_std::ratio<1L,_1000L>_> local_128;
  allocator local_119;
  string local_118 [39];
  allocator local_f1;
  string local_f0 [39];
  allocator local_c9;
  string local_c8 [36];
  int local_a4;
  string local_a0 [48];
  string local_70 [32];
  undefined1 local_50 [8];
  string binStr;
  string *loaderFile_local;
  bool flash_local;
  string *binFile_local;
  Loader *this_local;
  
  if (flash) {
    std::__cxx11::string::string(local_70,(string *)binFile);
    fileToBinStr((Loader *)local_50,(string *)this);
    std::__cxx11::string::~string(local_70);
    poVar3 = std::operator<<((ostream *)&std::cout,"Initializing FPGA...");
    std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
    std::__cxx11::string::string(local_a0,(string *)loaderFile);
    bVar1 = loadBin(this,(string *)local_a0);
    std::__cxx11::string::~string(local_a0);
    if (((bVar1 ^ 0xffU) & 1) == 0) {
      bVar1 = Jtag::setFreq(this->device,1500000.0);
      if (bVar1) {
        poVar3 = std::operator<<((ostream *)&std::cout,"Erasing...");
        std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
        bVar1 = setIR(this,USER1);
        if (bVar1) {
          std::allocator<char>::allocator();
          std::__cxx11::string::string(local_c8,"0",&local_c9);
          std::allocator<char>::allocator();
          std::__cxx11::string::string(local_f0,"",&local_f1);
          std::allocator<char>::allocator();
          std::__cxx11::string::string(local_118,"",&local_119);
          bVar1 = shiftDR(this,1,(string *)local_c8,(string *)local_f0,(string *)local_118);
          std::__cxx11::string::~string(local_118);
          std::allocator<char>::~allocator((allocator<char> *)&local_119);
          std::__cxx11::string::~string(local_f0);
          std::allocator<char>::~allocator((allocator<char> *)&local_f1);
          std::__cxx11::string::~string(local_c8);
          std::allocator<char>::~allocator((allocator<char> *)&local_c9);
          if (((bVar1 ^ 0xffU) & 1) == 0) {
            local_12c = 100;
            std::chrono::duration<long,std::ratio<1l,1000l>>::duration<int,void>
                      ((duration<long,std::ratio<1l,1000l>> *)&local_128,&local_12c);
            std::this_thread::sleep_for<long,std::ratio<1l,1000l>>(&local_128);
            poVar3 = std::operator<<((ostream *)&std::cout,"Writing...");
            std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
            bVar1 = setIR(this,USER2);
            if (bVar1) {
              iVar2 = std::__cxx11::string::length();
              std::__cxx11::string::string(local_150,(string *)local_50);
              std::allocator<char>::allocator();
              std::__cxx11::string::string(local_170,"",&local_171);
              std::allocator<char>::allocator();
              std::__cxx11::string::string(local_198,"",&local_199);
              bVar1 = shiftDR(this,iVar2 << 2,(string *)local_150,(string *)local_170,
                              (string *)local_198);
              std::__cxx11::string::~string(local_198);
              std::allocator<char>::~allocator((allocator<char> *)&local_199);
              std::__cxx11::string::~string(local_170);
              std::allocator<char>::~allocator((allocator<char> *)&local_171);
              std::__cxx11::string::~string(local_150);
              if (((bVar1 ^ 0xffU) & 1) == 0) {
                bVar1 = resetState(this);
                if (bVar1) {
                  local_1ac = 100;
                  std::chrono::duration<long,std::ratio<1l,1000l>>::duration<int,void>
                            ((duration<long,std::ratio<1l,1000l>> *)&local_1a8,&local_1ac);
                  std::this_thread::sleep_for<long,std::ratio<1l,1000l>>(&local_1a8);
                  poVar3 = std::operator<<((ostream *)&std::cout,"Resetting FPGA...");
                  std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
                  bVar1 = setIR(this,JPROGRAM);
                  if (bVar1) {
                    local_a4 = 0;
                  }
                  else {
                    this_local._7_1_ = 0;
                    local_a4 = 1;
                  }
                }
                else {
                  this_local._7_1_ = 0;
                  local_a4 = 1;
                }
              }
              else {
                this_local._7_1_ = 0;
                local_a4 = 1;
              }
            }
            else {
              this_local._7_1_ = 0;
              local_a4 = 1;
            }
          }
          else {
            this_local._7_1_ = 0;
            local_a4 = 1;
          }
        }
        else {
          this_local._7_1_ = 0;
          local_a4 = 1;
        }
      }
      else {
        poVar3 = std::operator<<((ostream *)&std::cerr,"Failed to set JTAG frequency!");
        std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
        this_local._7_1_ = 0;
        local_a4 = 1;
      }
    }
    else {
      poVar3 = std::operator<<((ostream *)&std::cerr,"Failed to initialize FPGA!");
      std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
      this_local._7_1_ = 0;
      local_a4 = 1;
    }
    std::__cxx11::string::~string((string *)local_50);
    if (local_a4 != 0) goto LAB_0011c3fb;
  }
  else {
    poVar3 = std::operator<<((ostream *)&std::cout,"Programming FPGA...");
    std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
    std::__cxx11::string::string(local_1d0,(string *)binFile);
    bVar1 = loadBin(this,(string *)local_1d0);
    std::__cxx11::string::~string(local_1d0);
    if (((bVar1 ^ 0xffU) & 1) != 0) {
      poVar3 = std::operator<<((ostream *)&std::cerr,"Failed to initialize FPGA!");
      std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
      this_local._7_1_ = 0;
      goto LAB_0011c3fb;
    }
  }
  bVar1 = resetState(this);
  if (bVar1) {
    poVar3 = std::operator<<((ostream *)&std::cout,"Done.");
    std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
    this_local._7_1_ = 1;
  }
  else {
    this_local._7_1_ = 0;
  }
LAB_0011c3fb:
  return (bool)(this_local._7_1_ & 1);
}

Assistant:

bool Loader::writeBin(string binFile, bool flash, string loaderFile) {
	if (flash) {
		string binStr = fileToBinStr(binFile);

		cout << "Initializing FPGA..." << endl;
		if (!loadBin(loaderFile)) {
			cerr << "Failed to initialize FPGA!" << endl;
			return false;
		}

		if (!device->setFreq(1500000)) {
			cerr << "Failed to set JTAG frequency!" << endl;
			return false;
		}

		cout << "Erasing..." << endl;

		// Erase the flash
		if (!setIR(USER1))
			return false;

		if (!shiftDR(1, "0", "", ""))
			return false;

		std::this_thread::sleep_for(std::chrono::milliseconds(100));

		cout << "Writing..." << endl;

		// Write the flash
		if (!setIR(USER2))
			return false;

		if (!shiftDR(binStr.length() * 4, binStr, "", ""))
			return false;

		// If you enter the reset state after a write
		// the loader firmware resets the flash into
		// regular SPI mode and gets stuck in a dead FSM
		// state. You need to do this before issuing a
		// JPROGRAM command or the FPGA can't read the
		// flash.
		if (!resetState())
			return false;

		std::this_thread::sleep_for(std::chrono::milliseconds(100)); // 100ms delay is required before issuing JPROGRAM

		cout << "Resetting FPGA..." << endl;
		// JPROGRAM resets the FPGA configuration and will
		// cause it to read the flash memory
		if (!setIR(JPROGRAM))
			return false;
	} else {
		cout << "Programming FPGA..." << endl;
		if (!loadBin(binFile)) {
			cerr << "Failed to initialize FPGA!" << endl;
			return false;
		}
	}

	// reset just for good measure
	if (!resetState())
		return false;

	cout << "Done." << endl;
	return true;
}